

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thin_server.c
# Opt level: O0

void socket_accept_thin_client(void *cmv,void *sockv)

{
  uint16_t uVar1;
  int __fd;
  int iVar2;
  uint uVar3;
  undefined8 *__s;
  undefined8 uVar4;
  void *pvVar5;
  int in_ESI;
  thin_conn_data cd;
  int sock_opt_val;
  linger linger_val;
  int int_port_num;
  uint sock_len;
  sockaddr sock_addr;
  int sock;
  int conn_sock;
  CManager cm;
  int in_stack_ffffffffffffffac;
  CManager_conflict in_stack_ffffffffffffffb0;
  undefined4 local_44;
  undefined4 uVar6;
  undefined4 uVar7;
  socklen_t sVar8;
  sa_family_t in_stack_ffffffffffffffd0;
  uint16_t in_stack_ffffffffffffffd2;
  undefined4 in_stack_ffffffffffffffd4;
  int in_stack_ffffffffffffffdc;
  
  local_44 = 1;
  uVar6 = 1;
  uVar7 = 0x3c;
  __fd = accept(in_ESI,(sockaddr *)0x0,(socklen_t *)0x0);
  if (__fd == -1) {
    perror("Cannot accept socket connection");
    CM_fd_remove_select(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac);
    fprintf(_stderr,"failure in CMsockets  removing socket connection\n");
  }
  else {
    local_44 = 1;
    setsockopt(__fd,1,9,&local_44,4);
    iVar2 = setsockopt(__fd,1,0xd,&stack0xffffffffffffffc0,8);
    if (iVar2 == 0) {
      memset(&stack0xffffffffffffffd0,0,0x10);
      getsockname(__fd,(sockaddr *)&stack0xffffffffffffffd0,(socklen_t *)&stack0xffffffffffffffcc);
      uVar1 = ntohs(in_stack_ffffffffffffffd2);
      uVar3 = (uint)uVar1;
      memset(&stack0xffffffffffffffd0,0,0x10);
      sVar8 = 0x10;
      iVar2 = getpeername(__fd,(sockaddr *)&stack0xffffffffffffffd0,
                          (socklen_t *)&stack0xffffffffffffffcc);
      if (iVar2 == 0) {
        uVar1 = ntohs(in_stack_ffffffffffffffd2);
        uVar3 = (uint)uVar1;
      }
      __s = (undefined8 *)INT_CMmalloc((size_t)in_stack_ffffffffffffffb0);
      memset(__s,0,0x30);
      uVar4 = open_FFSfd((long)__fd,"r");
      *__s = uVar4;
      *(int *)(__s + 1) = __fd;
      pvVar5 = INT_CMmalloc((size_t)__s);
      __s[5] = pvVar5;
      *(undefined8 *)__s[5] = 0;
      INT_CM_fd_add_select
                ((CManager_conflict)CONCAT44(in_ESI,__fd),in_stack_ffffffffffffffdc,
                 (select_list_func)
                 CONCAT44(in_stack_ffffffffffffffd4,
                          CONCAT22(in_stack_ffffffffffffffd2,in_stack_ffffffffffffffd0)),
                 (void *)CONCAT44(sVar8,uVar3),(void *)CONCAT44(uVar7,uVar6));
    }
    else {
      perror("set SO_LINGER");
    }
  }
  return;
}

Assistant:

static void
socket_accept_thin_client(void *cmv, void * sockv)
{
    CManager cm = (CManager) cmv;
    SOCKET conn_sock = (int) (intptr_t)sockv;
    SOCKET sock;
    struct sockaddr sock_addr;
    unsigned int sock_len = sizeof(sock_addr);
    int int_port_num;
    struct linger linger_val;
    int sock_opt_val = 1;
    thin_conn_data cd;

#ifdef TCP_NODELAY
    int delay_value = 1;
#endif

    linger_val.l_onoff = 1;
    linger_val.l_linger = 60;
    if ((sock = accept(conn_sock, (struct sockaddr *) 0, (unsigned int *) 0)) == SOCKET_ERROR) {
	perror("Cannot accept socket connection");
	CM_fd_remove_select(cm, conn_sock);
	fprintf(stderr, "failure in CMsockets  removing socket connection\n");
	return;
    }
    sock_opt_val = 1;
    setsockopt(sock, SOL_SOCKET, SO_KEEPALIVE, (char *) &sock_opt_val,
	       sizeof(sock_opt_val));
    if (setsockopt(sock, SOL_SOCKET, SO_LINGER, (char *) &linger_val,
		   sizeof(struct linger)) != 0) {
	perror("set SO_LINGER");
	return;
    }
#ifdef TCP_NODELAY
    setsockopt(sock, IPPROTO_TCP, TCP_NODELAY, (char *) &delay_value,
	       sizeof(delay_value));
#endif

    sock_len = sizeof(sock_addr);
    memset(&sock_addr, 0, sock_len);
    getsockname(sock, (struct sockaddr *) &sock_addr, &sock_len);
    int_port_num = (unsigned short) ntohs(((struct sockaddr_in *) &sock_addr)->sin_port);

    memset(&sock_addr, 0, sizeof(sock_addr));
    sock_len = sizeof(sock_addr);
    if (getpeername(sock, &sock_addr,
		    &sock_len) == 0) {
	int_port_num = (unsigned short) ntohs(((struct sockaddr_in *) &sock_addr)->sin_port);
    }

    (void) int_port_num;
    cd = malloc(sizeof(*cd));
    memset(cd, 0, sizeof(*cd));
    cd->ffsfile = open_FFSfd((void*)(intptr_t)sock, "r");
    cd->fd = sock;
    cd->src_list = malloc(sizeof(cd->src_list[0]));
    cd->src_list[0] = NULL;
    INT_CM_fd_add_select(cm, sock,
		     (void (*)(void *, void *)) thin_data_available,
		       (void *) cm, (void *) cd);
}